

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool Internal_MergeCrossingEdgeChainsDoubleCallback
               (ON__UINT_PTR callback_context,ON_SubDEdgePtr left_eptr,ON_SubDEdgePtr right_eptr)

{
  bool bVar1;
  undefined1 uVar2;
  
  if (callback_context != 0) {
    bVar1 = ON_SubDEdgeChain::ContinueChainDefaultCallback(0x100,left_eptr,right_eptr);
    if (bVar1) {
      uVar2 = (**(code **)(callback_context + 8))
                        (*(undefined8 *)callback_context,left_eptr.m_ptr,right_eptr.m_ptr);
      return (bool)uVar2;
    }
  }
  return false;
}

Assistant:

static bool Internal_MergeCrossingEdgeChainsDoubleCallback(
  ON__UINT_PTR callback_context,
  ON_SubDEdgePtr left_eptr,
  ON_SubDEdgePtr right_eptr
)
{
  const Internal_MergeCrossingEdgeChainsDoubleCallbackContext* double_context = (Internal_MergeCrossingEdgeChainsDoubleCallbackContext*)callback_context;
  if (nullptr == double_context)
    return false;

  // ON_SubDEdgeChain::ContinueChainDefaultCallback(256,...) is the crossing edge check
  return
    ON_SubDEdgeChain::ContinueChainDefaultCallback(256, left_eptr, right_eptr)
    && double_context->m_f(double_context->m_c, left_eptr, right_eptr)
    ;
}